

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<kj::(anonymous_namespace)::SocketAddress>::~Array
          (Array<kj::(anonymous_namespace)::SocketAddress> *this)

{
  Array<kj::(anonymous_namespace)::SocketAddress> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }